

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mathCoreRecursive.cpp
# Opt level: O2

void mathCore::do_expansion(expression *a,expression *expandTo,expression *expandFrom)

{
  bool bVar1;
  iterator iVar2;
  expression *peVar3;
  expression *child;
  expSet tempSet;
  expression *local_68;
  _Rb_tree<expression_*,_expression_*,_std::_Identity<expression_*>,_compareUUID,_std::allocator<expression_*>_>
  local_60;
  
  bVar1 = is_and(a);
  if (bVar1) {
    bVar1 = is_DNF(expandTo);
    if (!bVar1) {
      return;
    }
    bVar1 = is_sum(expandFrom);
    if (!bVar1) {
      return;
    }
    distributive_law(a,expandTo,expandFrom);
    local_60._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_60._M_impl.super__Rb_tree_header._M_header;
    local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
    iVar2._M_node = (expandTo->contents)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    local_60._M_impl.super__Rb_tree_header._M_header._M_right =
         local_60._M_impl.super__Rb_tree_header._M_header._M_left;
    while ((_Rb_tree_header *)iVar2._M_node !=
           &(expandTo->contents)._M_t._M_impl.super__Rb_tree_header) {
      local_68 = *(expression **)(iVar2._M_node + 1);
      iVar2 = std::
              _Rb_tree<expression*,expression*,std::_Identity<expression*>,compareUUID,std::allocator<expression*>>
              ::erase_abi_cxx11_((_Rb_tree<expression*,expression*,std::_Identity<expression*>,compareUUID,std::allocator<expression*>>
                                  *)&expandTo->contents,iVar2._M_node);
      do_simplification(local_68);
      std::
      _Rb_tree<expression*,expression*,std::_Identity<expression*>,compareUUID,std::allocator<expression*>>
      ::_M_insert_equal<expression*const&>
                ((_Rb_tree<expression*,expression*,std::_Identity<expression*>,compareUUID,std::allocator<expression*>>
                  *)&local_60,&local_68);
    }
    peVar3 = (expression *)&local_60;
    mergeMultiSet(&expandTo->contents,(expSet *)peVar3);
    idempotent_law((mathCore *)expandTo,peVar3);
    universal_bound(expandTo);
  }
  else {
    bVar1 = is_or(a);
    if (!bVar1) {
      return;
    }
    bVar1 = is_CNF(expandTo);
    if (!bVar1) {
      return;
    }
    bVar1 = is_product(expandFrom);
    if (!bVar1) {
      return;
    }
    distributive_law(a,expandTo,expandFrom);
    local_60._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_60._M_impl.super__Rb_tree_header._M_header;
    local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
    iVar2._M_node = (expandTo->contents)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    local_60._M_impl.super__Rb_tree_header._M_header._M_right =
         local_60._M_impl.super__Rb_tree_header._M_header._M_left;
    while ((_Rb_tree_header *)iVar2._M_node !=
           &(expandTo->contents)._M_t._M_impl.super__Rb_tree_header) {
      local_68 = *(expression **)(iVar2._M_node + 1);
      iVar2 = std::
              _Rb_tree<expression*,expression*,std::_Identity<expression*>,compareUUID,std::allocator<expression*>>
              ::erase_abi_cxx11_((_Rb_tree<expression*,expression*,std::_Identity<expression*>,compareUUID,std::allocator<expression*>>
                                  *)&expandTo->contents,iVar2._M_node);
      do_simplification(local_68);
      std::
      _Rb_tree<expression*,expression*,std::_Identity<expression*>,compareUUID,std::allocator<expression*>>
      ::_M_insert_equal<expression*const&>
                ((_Rb_tree<expression*,expression*,std::_Identity<expression*>,compareUUID,std::allocator<expression*>>
                  *)&local_60,&local_68);
    }
    peVar3 = (expression *)&local_60;
    mergeMultiSet(&expandTo->contents,(expSet *)peVar3);
    idempotent_law((mathCore *)expandTo,peVar3);
    universal_bound(expandTo);
  }
  std::
  _Rb_tree<expression_*,_expression_*,_std::_Identity<expression_*>,_compareUUID,_std::allocator<expression_*>_>
  ::~_Rb_tree(&local_60);
  return;
}

Assistant:

void mathCore::do_expansion(expression* a, expression* expandTo, expression* expandFrom) {
	if (is_and(a)) {
		// (ABC+DEF)(X+Y)
		// (ABC(X+Y) + DEF(X+Y))
		if (is_DNF(expandTo) && is_sum(expandFrom)) {
			distributive_law(a, expandTo, expandFrom);
			
			expSet tempSet;
			auto iter = expandTo->contents.begin();
			expression* child;

			while (iter != expandTo->contents.end()) {
				child = *iter;
				iter = expandTo->contents.erase(iter);


				do_simplification(child);
				tempSet.insert(child);
			}
			mergeMultiSet(expandTo->contents, tempSet);
			idempotent_law(expandTo);
			universal_bound(expandTo);
		}
	}
	else if (is_or(a)) {
		// (A+B+C)(D+E+F) + (ABCD)
		// (A+B+C+ABCD)(D+E+F+ABCD)
		if (is_CNF(expandTo) && is_product(expandFrom)) {
			distributive_law(a, expandTo, expandFrom);

			expSet tempSet;
			auto iter = expandTo->contents.begin();
			expression* child;

			while (iter != expandTo->contents.end()) {
				child = *iter;
				iter = expandTo->contents.erase(iter);
				do_simplification(child);
				tempSet.insert(child);
			}
			mergeMultiSet(expandTo->contents, tempSet);
			idempotent_law(expandTo);
			universal_bound(expandTo);
		}
	}
}